

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void flatbuffers::python::anon_unknown_0::PythonStubGenerator::DeclareUOffset
               (stringstream *stub,Imports *imports)

{
  ostream *poVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"flatbuffers",&local_31);
  Imports::Import(imports,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"typing",&local_31);
  Imports::Import(imports,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((ostream *)(stub + 0x10),
                           "uoffset: typing.TypeAlias = flatbuffers.number_types.UOffsetTFlags.py_type\n"
                          );
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

static void DeclareUOffset(std::stringstream &stub, Imports *imports) {
    imports->Import("flatbuffers");
    imports->Import("typing");
    stub << "uoffset: typing.TypeAlias = "
            "flatbuffers.number_types.UOffsetTFlags.py_type\n"
         << '\n';
  }